

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modeq.cpp
# Opt level: O0

ll solve_modeq(ll a,ll b,ll m)

{
  ll lVar1;
  pair<long_long,_long_long> pVar2;
  undefined8 local_50;
  ll k;
  ll t;
  ll g;
  ll m_local;
  ll b_local;
  ll a_local;
  
  lVar1 = gcd(a % m,m);
  if ((b % m) % lVar1 == 0) {
    pVar2 = extgcd(a % m,m);
    local_50 = pVar2.first;
    a_local = ((local_50 * ((b % m) / lVar1)) % m + m) % m;
  }
  else {
    a_local = -1;
  }
  return a_local;
}

Assistant:

ll solve_modeq(ll a, ll b, ll m) {
	// We have a * k + m * y = b for unknown k and y
	a %= m, b %= m;
	ll g = gcd(a, m);
	if (b % g)
		return -1;

	ll t = b / g;
	ll k = extgcd(a, m).first * t;
	return (k % m + m) % m;
}